

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O1

void __thiscall
Am_Load_Save_Context::Am_Load_Save_Context(Am_Load_Save_Context *this,Am_Value *in_value)

{
  uint *puVar1;
  Am_Load_Save_Context_Data *pAVar2;
  
  pAVar2 = (Am_Load_Save_Context_Data *)(in_value->value).wrapper_value;
  this->data = pAVar2;
  if (pAVar2 != (Am_Load_Save_Context_Data *)0x0) {
    if (Am_Load_Save_Context_Data::id != in_value->type) {
      Am_Error();
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}